

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O3

sylvan_ser * sylvan_ser_reversed_iter_next(avl_iter_t *iter)

{
  size_t sVar1;
  sylvan_ser *psVar2;
  long *plVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  
  if (iter[1].height == 0) {
    sVar4 = 0;
  }
  else {
    sVar1 = iter->height;
    plVar3 = (long *)iter[sVar1 + 1].height;
    if (plVar3 != (long *)0x0) {
      do {
        plVar3 = (long *)*plVar3;
        iter[sVar1 + 2].height = (size_t)plVar3;
        sVar1 = sVar1 + 1;
      } while (plVar3 != (long *)0x0);
      iter->height = sVar1;
    }
    sVar4 = iter[sVar1].height;
    sVar5 = *(size_t *)(sVar4 + 8);
    sVar6 = sVar4;
    if (sVar5 == 0) {
      do {
        sVar1 = sVar1 - 1;
        if (sVar1 == 0) break;
        bVar7 = sVar6 == *(size_t *)(iter[sVar1].height + 8);
        sVar6 = iter[sVar1].height;
      } while (bVar7);
      sVar5 = 0;
      iter->height = sVar1;
    }
    iter[sVar1 + 1].height = sVar5;
  }
  psVar2 = (sylvan_ser *)(sVar4 + 0x18);
  if (sVar4 == 0) {
    psVar2 = (sylvan_ser *)0x0;
  }
  return psVar2;
}

Assistant:

static inline avl_node_t*
avl_iter_next(avl_iter_t *iter)
{
    /* when first node is NULL, we're done */
    if (iter->nodes[0] == NULL) return NULL;

    /* if the head is not NULL, first entry... */
    while (iter->nodes[iter->height] != NULL) {
        iter->nodes[iter->height+1] = iter->nodes[iter->height]->left;
        iter->height++;
    }

    /* head is now NULL, take parent as result */
    avl_node_t *result = iter->nodes[iter->height-1];

    if (result->right != NULL) {
        /* if we can go right, do that */
        iter->nodes[iter->height] = result->right;
    } else {
        /* cannot go right, backtrack */
        do {
            iter->height--;
        } while (iter->height > 0 && iter->nodes[iter->height] == iter->nodes[iter->height-1]->right);
        iter->nodes[iter->height] = NULL; /* set head to NULL: second entry */
    }

    return result;
}